

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::PatternMatchesString(char *pattern,char *str)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  byte in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe1;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  
  iVar2 = (int)*in_RDI;
  if (*in_RDI != '\0') {
    if (iVar2 == 0x2a) {
      if (*in_RSI != '\0') {
        bVar1 = PatternMatchesString
                          (in_RSI,(char *)CONCAT44(0x2a,CONCAT13(in_stack_ffffffffffffffe3,
                                                                 CONCAT12(in_stack_ffffffffffffffe2,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0)))));
        in_stack_ffffffffffffffe2 = 1;
        if (bVar1) {
          return true;
        }
      }
      bVar1 = PatternMatchesString
                        (in_RSI,(char *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffe3,
                                                                CONCAT12(in_stack_ffffffffffffffe2,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0)))));
      return bVar1;
    }
    if (iVar2 != 0x3a) {
      if (iVar2 == 0x3f) {
        if (*in_RSI == '\0') {
          return false;
        }
        bVar1 = PatternMatchesString
                          (in_RSI,(char *)CONCAT44(0x3f,(uint)CONCAT12(in_stack_ffffffffffffffe2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))));
        return bVar1;
      }
      if (*in_RDI != *in_RSI) {
        return false;
      }
      bVar1 = PatternMatchesString
                        (in_RSI,(char *)CONCAT44(iVar2,CONCAT13(in_stack_ffffffffffffffe3,
                                                                CONCAT12(in_stack_ffffffffffffffe2,
                                                                         (ushort)
                                                  in_stack_ffffffffffffffe0))));
      return bVar1;
    }
  }
  return *in_RSI == '\0';
}

Assistant:

bool UnitTestOptions::PatternMatchesString(const char *pattern,
                                           const char *str) {
  switch (*pattern) {
    case '\0':
    case ':':  // Either ':' or '\0' marks the end of the pattern.
      return *str == '\0';
    case '?':  // Matches any single character.
      return *str != '\0' && PatternMatchesString(pattern + 1, str + 1);
    case '*':  // Matches any string (possibly empty) of characters.
      return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
          PatternMatchesString(pattern + 1, str);
    default:  // Non-special character.  Matches itself.
      return *pattern == *str &&
          PatternMatchesString(pattern + 1, str + 1);
  }
}